

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O3

void d_ctl_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("sig~");
  sig_tilde_class = class_new(ptVar2,sig_tilde_new,(t_method)0x0,0x38,0,A_DEFFLOAT,0);
  class_doaddfloat(sig_tilde_class,sig_tilde_float);
  p_Var1 = sig_tilde_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,sig_tilde_dsp,ptVar2,A_CANT);
  ptVar2 = gensym("line~");
  line_tilde_class = class_new(ptVar2,line_tilde_new,(t_method)0x0,0x58,0,A_NULL);
  class_doaddfloat(line_tilde_class,line_tilde_float);
  p_Var1 = line_tilde_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,line_tilde_dsp,ptVar2,A_CANT);
  p_Var1 = line_tilde_class;
  ptVar2 = gensym("stop");
  class_addmethod(p_Var1,line_tilde_stop,ptVar2,A_NULL);
  ptVar2 = gensym("vline~");
  vline_tilde_class = class_new(ptVar2,vline_tilde_new,vline_tilde_stop,0x88,0,A_NULL);
  class_doaddfloat(vline_tilde_class,vline_tilde_float);
  p_Var1 = vline_tilde_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,vline_tilde_dsp,ptVar2,A_CANT);
  p_Var1 = vline_tilde_class;
  ptVar2 = gensym("stop");
  class_addmethod(p_Var1,vline_tilde_stop,ptVar2,A_NULL);
  ptVar2 = gensym("snapshot~");
  snapshot_tilde_class = class_new(ptVar2,snapshot_tilde_new,(t_method)0x0,0x38,0,A_NULL);
  class_domainsignalin(snapshot_tilde_class,0x34);
  p_Var1 = snapshot_tilde_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,snapshot_tilde_dsp,ptVar2,A_CANT);
  p_Var1 = snapshot_tilde_class;
  ptVar2 = gensym("set");
  class_addmethod(p_Var1,snapshot_tilde_set,ptVar2,A_DEFFLOAT);
  class_addbang(snapshot_tilde_class,snapshot_tilde_bang);
  ptVar2 = gensym("vsnapshot~");
  vsnapshot_tilde_class = class_new(ptVar2,vsnapshot_tilde_new,vsnapshot_tilde_ff,0x50,0,A_NULL);
  class_domainsignalin(vsnapshot_tilde_class,0x40);
  p_Var1 = vsnapshot_tilde_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,vsnapshot_tilde_dsp,ptVar2,A_CANT);
  class_addbang(vsnapshot_tilde_class,vsnapshot_tilde_bang);
  env_tilde_setup();
  ptVar2 = gensym("threshold~");
  threshold_tilde_class =
       class_new(ptVar2,threshold_tilde_new,threshold_tilde_ff,0x68,0,A_DEFFLOAT,6,6,6,0);
  class_domainsignalin(threshold_tilde_class,0x48);
  p_Var1 = threshold_tilde_class;
  ptVar2 = gensym("set");
  class_addmethod(p_Var1,threshold_tilde_set,ptVar2,A_FLOAT,1,1,1,0);
  p_Var1 = threshold_tilde_class;
  ptVar2 = gensym("ft1");
  class_addmethod(p_Var1,threshold_tilde_ft1,ptVar2,A_FLOAT,0);
  p_Var1 = threshold_tilde_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,threshold_tilde_dsp,ptVar2,A_CANT,0);
  return;
}

Assistant:

static void sig_tilde_setup(void)
{
    sig_tilde_class = class_new(gensym("sig~"), (t_newmethod)sig_tilde_new, 0,
        sizeof(t_sig), 0, A_DEFFLOAT, 0);
    class_addfloat(sig_tilde_class, (t_method)sig_tilde_float);
    class_addmethod(sig_tilde_class, (t_method)sig_tilde_dsp,
        gensym("dsp"), A_CANT, 0);
}